

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O3

UtcDate * FIX::UtcDateConvertor::convert(UtcDate *__return_storage_ptr__,string *value)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  FieldConvertError *this;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  
  if (value->_M_string_length == 8) {
    pcVar1 = (value->_M_dataplus)._M_p;
    lVar3 = 0;
    do {
      if (9 < (int)pcVar1[lVar3] - 0x30U) {
        this = (FieldConvertError *)__cxa_allocate_exception(0x50);
        FieldConvertError::FieldConvertError(this,value);
        goto LAB_00164356;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    if (((int)pcVar1[5] + pcVar1[4] * 10) - 0x21dU < 0xfffffff4) {
      this = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(this,value);
    }
    else {
      if (0xffffffe0 < ((int)pcVar1[7] + pcVar1[6] * 10) - 0x230U) {
        iVar4 = (int)pcVar1[5] + pcVar1[4] * 10;
        uVar5 = iVar4 - 0x1e0;
        uVar7 = iVar4 - 0x1d4;
        if (uVar5 >= 0x33) {
          uVar7 = uVar5;
        }
        iVar6 = ((int)pcVar1[3] + ((int)pcVar1[2] + ((int)pcVar1[1] + *pcVar1 * 10) * 10) * 10) -
                (uint)(uVar5 < 0x33);
        iVar4 = iVar6 + -0xbd90;
        iVar6 = iVar6 + -0xbd8d;
        if (-1 < iVar4) {
          iVar6 = iVar4;
        }
        iVar2 = (int)((ulong)((long)iVar4 * -0x51eb851f) >> 0x20);
        (__return_storage_ptr__->super_DateTime).m_date =
             (int)pcVar1[7] + pcVar1[6] * 10 +
             iVar4 / 400 + (int)(short)((short)uVar7 * 0x99 + -0x1e79) / 5 +
             ((iVar2 >> 5) - (iVar2 >> 0x1f)) + (iVar6 >> 2) + iVar4 * 0x16d + -0x7f3d;
        (__return_storage_ptr__->super_DateTime).m_time = 0;
        (__return_storage_ptr__->super_DateTime)._vptr_DateTime =
             (_func_int **)&PTR__DateTime_001f5a28;
        return __return_storage_ptr__;
      }
      this = (FieldConvertError *)__cxa_allocate_exception(0x50);
      FieldConvertError::FieldConvertError(this,value);
    }
  }
  else {
    this = (FieldConvertError *)__cxa_allocate_exception(0x50);
    FieldConvertError::FieldConvertError(this,value);
  }
LAB_00164356:
  __cxa_throw(this,&FieldConvertError::typeinfo,FIX::Exception::~Exception);
}

Assistant:

EXCEPT(FieldConvertError) {
    if (value.size() != 8) {
      throw FieldConvertError(value);
    }

    int i = 0;
    for (int c = 0; c < 8; ++c) {
      if (!IS_DIGIT(value[i++])) {
        throw FieldConvertError(value);
      }
    }

    int year, mon, mday;

    i = 0;

    year = value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';
    year = 10 * year + value[i++] - '0';

    mon = value[i++] - '0';
    mon = 10 * mon + value[i++] - '0';
    if (mon < 1 || 12 < mon) {
      throw FieldConvertError(value);
    }

    mday = value[i++] - '0';
    mday = 10 * mday + value[i++] - '0';
    if (mday < 1 || 31 < mday) {
      throw FieldConvertError(value);
    }

    return UtcDateOnly(mday, mon, year);
  }